

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_uses_schema_nodeid(char *nodeid,lys_node *start,lys_node_grp **ret)

{
  lys_module *plVar1;
  lys_module *plVar2;
  ly_ctx *plVar3;
  int local_4c;
  int local_48;
  int nam_len;
  int mod_prefix_len;
  int i;
  char *name;
  char *mod_prefix;
  lys_module *module;
  lys_node_grp **ret_local;
  lys_node *start_local;
  char *nodeid_local;
  
  module = (lys_module *)ret;
  ret_local = (lys_node_grp **)start;
  start_local = (lys_node *)nodeid;
  nam_len = parse_node_identifier(nodeid,&name,&local_48,(char **)&mod_prefix_len,&local_4c);
  if ((nam_len < 1) || (start_local->padding[(long)nam_len + -0x1c] != '\0')) {
    nodeid_local._4_4_ = 1 - nam_len;
  }
  else {
    plVar1 = lys_get_import_module((lys_module *)ret_local[6],name,local_48,(char *)0x0,0);
    if (plVar1 == (lys_module *)0x0) {
      nodeid_local._4_4_ = -1;
    }
    else {
      mod_prefix = (char *)plVar1;
      plVar2 = lys_main_module((lys_module *)ret_local[6]);
      if (plVar1 != plVar2) {
        ret_local = *(lys_node_grp ***)(mod_prefix + 0xa0);
      }
      plVar3 = (ly_ctx *)lys_find_grouping_up(_mod_prefix_len,(lys_node *)ret_local);
      module->ctx = plVar3;
      nodeid_local._4_4_ = 0;
    }
  }
  return nodeid_local._4_4_;
}

Assistant:

static int
resolve_uses_schema_nodeid(const char *nodeid, const struct lys_node *start, const struct lys_node_grp **ret)
{
    const struct lys_module *module;
    const char *mod_prefix, *name;
    int i, mod_prefix_len, nam_len;

    /* parse the identifier, it must be parsed on one call */
    if (((i = parse_node_identifier(nodeid, &mod_prefix, &mod_prefix_len, &name, &nam_len)) < 1) || nodeid[i]) {
        return -i + 1;
    }

    module = lys_get_import_module(start->module, mod_prefix, mod_prefix_len, NULL, 0);
    if (!module) {
        return -1;
    }
    if (module != lys_main_module(start->module)) {
        start = module->data;
    }

    *ret = lys_find_grouping_up(name, (struct lys_node *)start);

    return EXIT_SUCCESS;
}